

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

ostream * operator<<(ostream *out,sockaddr_in *addr)

{
  sockaddr_in *this;
  uint16_t uVar1;
  ostream *poVar2;
  string local_38;
  sockaddr_in *local_18;
  sockaddr_in *addr_local;
  ostream *out_local;
  
  local_18 = addr;
  addr_local = (sockaddr_in *)out;
  poVar2 = std::operator<<(out,"[");
  bdnet_inet_ntoa_abi_cxx11_(&local_38,(in_addr)(local_18->sin_addr).s_addr);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,":");
  std::__cxx11::string::~string((string *)&local_38);
  this = addr_local;
  uVar1 = htons(local_18->sin_port);
  poVar2 = (ostream *)std::ostream::operator<<(this,uVar1);
  std::operator<<(poVar2,"]");
  return (ostream *)addr_local;
}

Assistant:

std::ostream &operator<<(std::ostream &out, struct sockaddr_in &addr) {
	out << "[" << bdnet_inet_ntoa(addr.sin_addr) << ":";
	out << htons(addr.sin_port) << "]";
	return out;
}